

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

Source * __thiscall
Hpipe::Pool<Hpipe::Source,32>::New<char*&>(Pool<Hpipe::Source,32> *this,char **args)

{
  int iVar1;
  void *pvVar2;
  Source *this_00;
  Set *n;
  char **args_local;
  Pool<Hpipe::Source,_32> *this_local;
  
  if (*(int *)(this + 8) == 0x20) {
    pvVar2 = operator_new(0x408);
    *(undefined8 *)((long)pvVar2 + 0x400) = *(undefined8 *)this;
    *(void **)this = pvVar2;
    *(undefined4 *)(this + 8) = 0;
  }
  iVar1 = *(int *)(this + 8);
  *(int *)(this + 8) = iVar1 + 1;
  this_00 = (Source *)(*(long *)this + (long)iVar1 * 0x20);
  Source::Source(this_00,*args);
  return this_00;
}

Assistant:

T *New( Args&&... args ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        return new ( last->items + sizeof( T ) * used++ ) T( std::forward<Args>( args )... );
    }